

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteExpr(BinaryWriter *this,Func *func,Expr *expr)

{
  Module *pMVar1;
  Stream *pSVar2;
  Expr *pEVar3;
  bool bVar4;
  ExprType EVar5;
  Index IVar6;
  OpcodeExpr<(wabt::ExprType)6> *pOVar7;
  BlockExprBase<(wabt::ExprType)7> *pBVar8;
  VarExpr<(wabt::ExprType)8> *pVVar9;
  VarExpr<(wabt::ExprType)9> *pVVar10;
  size_type value;
  VarVector *this_00;
  VarExpr<(wabt::ExprType)11> *pVVar11;
  VarExpr<(wabt::ExprType)32> *pVVar12;
  CallIndirectExpr *pCVar13;
  ReturnCallIndirectExpr *pRVar14;
  OpcodeExpr<(wabt::ExprType)13> *pOVar15;
  ConstExpr *pCVar16;
  OpcodeExpr<(wabt::ExprType)15> *pOVar17;
  VarExpr<(wabt::ExprType)17> *pVVar18;
  VarExpr<(wabt::ExprType)18> *pVVar19;
  BlockExprBase<(wabt::ExprType)22> *pBVar20;
  VarExpr<(wabt::ExprType)24> *pVVar21;
  VarExpr<(wabt::ExprType)27> *pVVar22;
  VarExpr<(wabt::ExprType)42> *pVVar23;
  VarExpr<(wabt::ExprType)40> *pVVar24;
  VarExpr<(wabt::ExprType)35> *pVVar25;
  VarExpr<(wabt::ExprType)36> *pVVar26;
  VarExpr<(wabt::ExprType)43> *pVVar27;
  VarExpr<(wabt::ExprType)45> *pVVar28;
  OpcodeExpr<(wabt::ExprType)47> *pOVar29;
  OpcodeExpr<(wabt::ExprType)44> *pOVar30;
  SimdLaneOpExpr *pSVar31;
  SimdShuffleOpExpr *pSVar32;
  Opcode local_1b0;
  undefined8 local_1ac;
  undefined8 local_1a4;
  Enum local_19c;
  Enum local_198;
  Enum local_194;
  Opcode opcode_1;
  Opcode opcode;
  Opcode local_184;
  Opcode local_180;
  Opcode local_17c;
  TryExpr *local_178;
  TryExpr *try_expr;
  Index local_168;
  Opcode local_164;
  Index index_13;
  Opcode local_15c;
  Index index_12;
  Opcode local_154;
  Index index_11;
  Opcode local_14c;
  Opcode local_148;
  Opcode local_144;
  Index local_140;
  Opcode local_13c;
  Index index_10;
  Opcode local_134;
  Index index_9;
  Opcode local_12c;
  Index local_128;
  Opcode local_124;
  Index index_8;
  Opcode local_11c;
  Index local_118;
  Opcode local_114;
  Index index_7;
  Opcode local_10c;
  Opcode local_108;
  Opcode local_104;
  Index local_100;
  Opcode local_fc;
  Index index_6;
  IfExceptExpr *if_except_expr;
  Opcode local_e8;
  Opcode local_e4;
  IfExpr *local_e0;
  IfExpr *if_expr;
  Index local_d0;
  Opcode local_cc;
  Index index_5;
  Opcode local_c4;
  Index index_4;
  uint64_t local_bc;
  undefined8 local_b4;
  Opcode local_ac;
  Opcode local_a8;
  Opcode local_a4;
  Opcode local_a0;
  Opcode local_9c;
  Const *local_98;
  Const *const_;
  Opcode local_88;
  Index local_84;
  Opcode local_80;
  Index index_3;
  Opcode local_78;
  Index index_2;
  Opcode local_70;
  Index index_1;
  reference pVStack_68;
  Index index;
  Var *var;
  const_iterator __end3;
  const_iterator __begin3;
  VarVector *__range3;
  Index depth;
  BrTableExpr *br_table_expr;
  Opcode local_30;
  Opcode local_2c;
  Opcode local_28;
  Enum local_24;
  Expr *local_20;
  Expr *expr_local;
  Func *func_local;
  BinaryWriter *this_local;
  
  local_20 = expr;
  expr_local = (Expr *)func;
  func_local = (Func *)this;
  EVar5 = Expr::type(expr);
  pEVar3 = expr_local;
  switch(EVar5) {
  case AtomicLoad:
    (anonymous_namespace)::BinaryWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
              ((BinaryWriter *)this,(Func *)expr_local,local_20,"memory offset");
    break;
  case AtomicRmw:
    (anonymous_namespace)::BinaryWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
              ((BinaryWriter *)this,(Func *)expr_local,local_20,"memory offset");
    break;
  case AtomicRmwCmpxchg:
    (anonymous_namespace)::BinaryWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
              ((BinaryWriter *)this,(Func *)expr_local,local_20,"memory offset");
    break;
  case AtomicStore:
    (anonymous_namespace)::BinaryWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
              ((BinaryWriter *)this,(Func *)expr_local,local_20,"memory offset");
    break;
  case AtomicWait:
    (anonymous_namespace)::BinaryWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
              ((BinaryWriter *)this,(Func *)expr_local,local_20,"memory offset");
    break;
  case AtomicWake:
    (anonymous_namespace)::BinaryWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)5>>
              ((BinaryWriter *)this,(Func *)expr_local,local_20,"memory offset");
    break;
  case Binary:
    pSVar2 = this->stream_;
    pOVar7 = cast<wabt::OpcodeExpr<(wabt::ExprType)6>,wabt::Expr>(local_20);
    local_24 = (pOVar7->opcode).enum_;
    WriteOpcode(pSVar2,(Opcode)local_24);
    break;
  case Block:
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_28,Block);
    WriteOpcode(pSVar2,local_28);
    pBVar8 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(local_20);
    WriteBlockDecl(this,&(pBVar8->block).decl);
    pEVar3 = expr_local;
    pBVar8 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(local_20);
    WriteExprList(this,(Func *)pEVar3,&(pBVar8->block).exprs);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_2c,End);
    WriteOpcode(pSVar2,local_2c);
    break;
  case Br:
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_30,Br);
    WriteOpcode(pSVar2,local_30);
    pSVar2 = this->stream_;
    pVVar9 = cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(local_20);
    IVar6 = GetLabelVarDepth(this,&pVVar9->var);
    WriteU32Leb128(pSVar2,IVar6,"break depth");
    break;
  case BrIf:
    pSVar2 = this->stream_;
    Opcode::Opcode((Opcode *)((long)&br_table_expr + 4),BrIf);
    WriteOpcode(pSVar2,br_table_expr._4_4_);
    pSVar2 = this->stream_;
    pVVar10 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(local_20);
    IVar6 = GetLabelVarDepth(this,&pVVar10->var);
    WriteU32Leb128(pSVar2,IVar6,"break depth");
    break;
  case BrTable:
    _depth = cast<wabt::BrTableExpr,wabt::Expr>(local_20);
    pSVar2 = this->stream_;
    Opcode::Opcode((Opcode *)((long)&__range3 + 4),BrTable);
    WriteOpcode(pSVar2,__range3._4_4_);
    pSVar2 = this->stream_;
    value = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::size(&_depth->targets);
    WriteU32Leb128<unsigned_long>(pSVar2,value,"num targets");
    this_00 = &_depth->targets;
    __end3 = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::begin(this_00);
    var = (Var *)std::vector<wabt::Var,_std::allocator<wabt::Var>_>::end(this_00);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>
                                       *)&var), bVar4) {
      pVStack_68 = __gnu_cxx::
                   __normal_iterator<const_wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>
                   ::operator*(&__end3);
      __range3._0_4_ = GetLabelVarDepth(this,pVStack_68);
      WriteU32Leb128(this->stream_,(Index)__range3,"break depth");
      __gnu_cxx::
      __normal_iterator<const_wabt::Var_*,_std::vector<wabt::Var,_std::allocator<wabt::Var>_>_>::
      operator++(&__end3);
    }
    __range3._0_4_ = GetLabelVarDepth(this,&_depth->default_target);
    WriteU32Leb128(this->stream_,(Index)__range3,"break depth for default");
    break;
  case Call:
    pMVar1 = this->module_;
    pVVar11 = cast<wabt::VarExpr<(wabt::ExprType)11>,wabt::Expr>(local_20);
    index_1 = Module::GetFuncIndex(pMVar1,&pVVar11->var);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_70,Call);
    WriteOpcode(pSVar2,local_70);
    WriteU32Leb128WithReloc(this,index_1,"function index",First);
    break;
  case CallIndirect:
    pMVar1 = this->module_;
    pCVar13 = cast<wabt::CallIndirectExpr,wabt::Expr>(local_20);
    index_3 = Module::GetFuncTypeIndex(pMVar1,&pCVar13->decl);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_80,CallIndirect);
    WriteOpcode(pSVar2,local_80);
    WriteU32Leb128WithReloc(this,index_3,"signature index",TypeIndexLEB);
    WriteU32Leb128<int>(this->stream_,0,"call_indirect reserved");
    break;
  case Compare:
    pSVar2 = this->stream_;
    pOVar15 = cast<wabt::OpcodeExpr<(wabt::ExprType)13>,wabt::Expr>(local_20);
    const_._4_4_ = (pOVar15->opcode).enum_;
    WriteOpcode(pSVar2,const_._4_4_);
    break;
  case Const:
    pCVar16 = cast<wabt::ConstExpr,wabt::Expr>(local_20);
    local_98 = &pCVar16->const_;
    switch((pCVar16->const_).type) {
    case V128:
      pSVar2 = this->stream_;
      Opcode::Opcode(&local_ac,V128Const);
      WriteOpcode(pSVar2,local_ac);
      local_bc = (local_98->field_2).u64;
      local_b4 = *(undefined8 *)((long)&local_98->field_2 + 8);
      Stream::WriteU128(this->stream_,(v128)*&(local_98->field_2).v128_bits.v,"v128 literal",No);
      break;
    case F64:
      pSVar2 = this->stream_;
      Opcode::Opcode(&local_a8,F64Const);
      WriteOpcode(pSVar2,local_a8);
      Stream::WriteU64(this->stream_,(local_98->field_2).u64,"f64 literal",No);
      break;
    case F32:
      pSVar2 = this->stream_;
      Opcode::Opcode(&local_a4,F32Const);
      WriteOpcode(pSVar2,local_a4);
      Stream::WriteU32(this->stream_,(local_98->field_2).u32,"f32 literal",No);
      break;
    case I64:
      pSVar2 = this->stream_;
      Opcode::Opcode(&local_a0,I64Const);
      WriteOpcode(pSVar2,local_a0);
      WriteS64Leb128(this->stream_,(local_98->field_2).u64,"i64 literal");
      break;
    case I32:
      pSVar2 = this->stream_;
      Opcode::Opcode(&local_9c,I32Const);
      WriteOpcode(pSVar2,local_9c);
      WriteS32Leb128(this->stream_,(local_98->field_2).u32,"i32 literal");
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer.cc"
                    ,0x1eb,
                    "void wabt::(anonymous namespace)::BinaryWriter::WriteExpr(const Func *, const Expr *)"
                   );
    }
    break;
  case Convert:
    pSVar2 = this->stream_;
    pOVar17 = cast<wabt::OpcodeExpr<(wabt::ExprType)15>,wabt::Expr>(local_20);
    index_4 = (pOVar17->opcode).enum_;
    WriteOpcode(pSVar2,(Opcode)index_4);
    break;
  case Drop:
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_c4,Drop);
    WriteOpcode(pSVar2,local_c4);
    break;
  case GetGlobal:
    pMVar1 = this->module_;
    pVVar18 = cast<wabt::VarExpr<(wabt::ExprType)17>,wabt::Expr>(local_20);
    index_5 = Module::GetGlobalIndex(pMVar1,&pVVar18->var);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_cc,GetGlobal);
    WriteOpcode(pSVar2,local_cc);
    WriteU32Leb128WithReloc(this,index_5,"global index",GlobalIndexLEB);
    break;
  case GetLocal:
    pVVar19 = cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(local_20);
    local_d0 = GetLocalIndex(this,(Func *)pEVar3,&pVVar19->var);
    pSVar2 = this->stream_;
    Opcode::Opcode((Opcode *)((long)&if_expr + 4),GetLocal);
    WriteOpcode(pSVar2,if_expr._4_4_);
    WriteU32Leb128(this->stream_,local_d0,"local index");
    break;
  case If:
    local_e0 = cast<wabt::IfExpr,wabt::Expr>(local_20);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_e4,If);
    WriteOpcode(pSVar2,local_e4);
    WriteBlockDecl(this,&(local_e0->true_).decl);
    WriteExprList(this,(Func *)expr_local,&(local_e0->true_).exprs);
    bVar4 = intrusive_list<wabt::Expr>::empty(&local_e0->false_);
    if (!bVar4) {
      pSVar2 = this->stream_;
      Opcode::Opcode(&local_e8,Else);
      WriteOpcode(pSVar2,local_e8);
      WriteExprList(this,(Func *)expr_local,&local_e0->false_);
    }
    pSVar2 = this->stream_;
    Opcode::Opcode((Opcode *)((long)&if_except_expr + 4),End);
    WriteOpcode(pSVar2,if_except_expr._4_4_);
    break;
  case IfExcept:
    _index_6 = cast<wabt::IfExceptExpr,wabt::Expr>(local_20);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_fc,IfExcept);
    WriteOpcode(pSVar2,local_fc);
    WriteBlockDecl(this,&(_index_6->true_).decl);
    local_100 = Module::GetExceptIndex(this->module_,&_index_6->except_var);
    WriteU32Leb128(this->stream_,local_100,"exception index");
    WriteExprList(this,(Func *)expr_local,&(_index_6->true_).exprs);
    bVar4 = intrusive_list<wabt::Expr>::empty(&_index_6->false_);
    if (!bVar4) {
      pSVar2 = this->stream_;
      Opcode::Opcode(&local_104,Else);
      WriteOpcode(pSVar2,local_104);
      WriteExprList(this,(Func *)expr_local,&_index_6->false_);
    }
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_108,End);
    WriteOpcode(pSVar2,local_108);
    break;
  case Load:
    (anonymous_namespace)::BinaryWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)21>>
              ((BinaryWriter *)this,(Func *)expr_local,local_20,"load offset");
    break;
  case Loop:
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_10c,Loop);
    WriteOpcode(pSVar2,local_10c);
    pBVar20 = cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>(local_20);
    WriteBlockDecl(this,&(pBVar20->block).decl);
    pEVar3 = expr_local;
    pBVar20 = cast<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Expr>(local_20);
    WriteExprList(this,(Func *)pEVar3,&(pBVar20->block).exprs);
    pSVar2 = this->stream_;
    Opcode::Opcode((Opcode *)&index_7,End);
    WriteOpcode(pSVar2,(Opcode)index_7);
    break;
  case MemoryCopy:
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_114,MemoryCopy);
    WriteOpcode(pSVar2,local_114);
    WriteU32Leb128<int>(this->stream_,0,"memory.copy reserved");
    break;
  case MemoryDrop:
    pMVar1 = this->module_;
    pVVar21 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(local_20);
    local_118 = Module::GetDataSegmentIndex(pMVar1,&pVVar21->var);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_11c,MemoryDrop);
    WriteOpcode(pSVar2,local_11c);
    WriteU32Leb128(this->stream_,local_118,"memory.drop segment");
    break;
  case MemoryFill:
    pSVar2 = this->stream_;
    Opcode::Opcode((Opcode *)&index_8,MemoryFill);
    WriteOpcode(pSVar2,(Opcode)index_8);
    WriteU32Leb128<int>(this->stream_,0,"memory.fill reserved");
    break;
  case MemoryGrow:
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_124,MemoryGrow);
    WriteOpcode(pSVar2,local_124);
    WriteU32Leb128<int>(this->stream_,0,"memory.grow reserved");
    break;
  case MemoryInit:
    pMVar1 = this->module_;
    pVVar22 = cast<wabt::VarExpr<(wabt::ExprType)27>,wabt::Expr>(local_20);
    local_128 = Module::GetDataSegmentIndex(pMVar1,&pVVar22->var);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_12c,MemoryInit);
    WriteOpcode(pSVar2,local_12c);
    WriteU32Leb128<int>(this->stream_,0,"memory.init reserved");
    WriteU32Leb128(this->stream_,local_128,"memory.init segment");
    break;
  case MemorySize:
    pSVar2 = this->stream_;
    Opcode::Opcode((Opcode *)&index_9,MemorySize);
    WriteOpcode(pSVar2,(Opcode)index_9);
    WriteU32Leb128<int>(this->stream_,0,"memory.size reserved");
    break;
  case Nop:
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_148,Nop);
    WriteOpcode(pSVar2,local_148);
    break;
  case Rethrow:
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_14c,Rethrow);
    WriteOpcode(pSVar2,local_14c);
    break;
  case Return:
    pSVar2 = this->stream_;
    Opcode::Opcode((Opcode *)&index_11,Return);
    WriteOpcode(pSVar2,(Opcode)index_11);
    break;
  case ReturnCall:
    pMVar1 = this->module_;
    pVVar12 = cast<wabt::VarExpr<(wabt::ExprType)32>,wabt::Expr>(local_20);
    index_2 = Module::GetFuncIndex(pMVar1,&pVVar12->var);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_78,ReturnCall);
    WriteOpcode(pSVar2,local_78);
    WriteU32Leb128WithReloc(this,index_2,"function index",First);
    break;
  case ReturnCallIndirect:
    pMVar1 = this->module_;
    pRVar14 = cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(local_20);
    local_84 = Module::GetFuncTypeIndex(pMVar1,&pRVar14->decl);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_88,ReturnCallIndirect);
    WriteOpcode(pSVar2,local_88);
    WriteU32Leb128WithReloc(this,local_84,"signature index",TypeIndexLEB);
    WriteU32Leb128<int>(this->stream_,0,"return_call_indirect reserved");
    break;
  case Select:
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_154,Select);
    WriteOpcode(pSVar2,local_154);
    break;
  case SetGlobal:
    pMVar1 = this->module_;
    pVVar25 = cast<wabt::VarExpr<(wabt::ExprType)35>,wabt::Expr>(local_20);
    index_12 = Module::GetGlobalIndex(pMVar1,&pVVar25->var);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_15c,SetGlobal);
    WriteOpcode(pSVar2,local_15c);
    WriteU32Leb128WithReloc(this,index_12,"global index",GlobalIndexLEB);
    break;
  case SetLocal:
    pVVar26 = cast<wabt::VarExpr<(wabt::ExprType)36>,wabt::Expr>(local_20);
    index_13 = GetLocalIndex(this,(Func *)pEVar3,&pVVar26->var);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_164,SetLocal);
    WriteOpcode(pSVar2,local_164);
    WriteU32Leb128(this->stream_,index_13,"local index");
    break;
  case SimdLaneOp:
    pSVar31 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(local_20);
    local_194 = (pSVar31->opcode).enum_;
    opcode_1.enum_ = local_194;
    WriteOpcode(this->stream_,(Opcode)local_194);
    pSVar2 = this->stream_;
    pSVar31 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(local_20);
    Stream::WriteU8(pSVar2,(uint)pSVar31->val & 0xff,"Simd Lane literal",No);
    break;
  case SimdShuffleOp:
    pSVar32 = cast<wabt::SimdShuffleOpExpr,wabt::Expr>(local_20);
    local_19c = (pSVar32->opcode).enum_;
    local_198 = local_19c;
    WriteOpcode(this->stream_,(Opcode)local_19c);
    pSVar2 = this->stream_;
    pSVar32 = cast<wabt::SimdShuffleOpExpr,wabt::Expr>(local_20);
    local_1ac = *(undefined8 *)(pSVar32->val).v;
    local_1a4 = *(undefined8 *)((pSVar32->val).v + 2);
    Stream::WriteU128(pSVar2,(v128)*&(pSVar32->val).v,"Simd Lane[16] literal",No);
    break;
  case Store:
    (anonymous_namespace)::BinaryWriter::WriteLoadStoreExpr<wabt::LoadStoreExpr<(wabt::ExprType)39>>
              ((BinaryWriter *)this,(Func *)expr_local,local_20,"store offset");
    break;
  case TableInit:
    pMVar1 = this->module_;
    pVVar24 = cast<wabt::VarExpr<(wabt::ExprType)40>,wabt::Expr>(local_20);
    local_140 = Module::GetElemSegmentIndex(pMVar1,&pVVar24->var);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_144,TableInit);
    WriteOpcode(pSVar2,local_144);
    WriteU32Leb128<int>(this->stream_,0,"table.init reserved");
    WriteU32Leb128(this->stream_,local_140,"table.init segment");
    break;
  case TableCopy:
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_134,TableCopy);
    WriteOpcode(pSVar2,local_134);
    WriteU32Leb128<int>(this->stream_,0,"table.copy reserved");
    break;
  case TableDrop:
    pMVar1 = this->module_;
    pVVar23 = cast<wabt::VarExpr<(wabt::ExprType)42>,wabt::Expr>(local_20);
    index_10 = Module::GetElemSegmentIndex(pMVar1,&pVVar23->var);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_13c,TableDrop);
    WriteOpcode(pSVar2,local_13c);
    WriteU32Leb128(this->stream_,index_10,"table.drop segment");
    break;
  case TeeLocal:
    pVVar27 = cast<wabt::VarExpr<(wabt::ExprType)43>,wabt::Expr>(local_20);
    local_168 = GetLocalIndex(this,(Func *)pEVar3,&pVVar27->var);
    pSVar2 = this->stream_;
    Opcode::Opcode((Opcode *)((long)&try_expr + 4),TeeLocal);
    WriteOpcode(pSVar2,try_expr._4_4_);
    WriteU32Leb128(this->stream_,local_168,"local index");
    break;
  case Ternary:
    pSVar2 = this->stream_;
    pOVar30 = cast<wabt::OpcodeExpr<(wabt::ExprType)44>,wabt::Expr>(local_20);
    WriteOpcode(pSVar2,(Opcode)(pOVar30->opcode).enum_);
    break;
  case Throw:
    pSVar2 = this->stream_;
    Opcode::Opcode((Opcode *)&try_expr,Throw);
    WriteOpcode(pSVar2,try_expr._0_4_);
    pSVar2 = this->stream_;
    pVVar28 = cast<wabt::VarExpr<(wabt::ExprType)45>,wabt::Expr>(local_20);
    IVar6 = GetExceptVarDepth(this,&pVVar28->var);
    WriteU32Leb128(pSVar2,IVar6,"throw exception");
    break;
  case Try:
    local_178 = cast<wabt::TryExpr,wabt::Expr>(local_20);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_17c,Try);
    WriteOpcode(pSVar2,local_17c);
    WriteBlockDecl(this,&(local_178->block).decl);
    WriteExprList(this,(Func *)expr_local,&(local_178->block).exprs);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_180,Catch);
    WriteOpcode(pSVar2,local_180);
    WriteExprList(this,(Func *)expr_local,&local_178->catch_);
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_184,End);
    WriteOpcode(pSVar2,local_184);
    break;
  case Unary:
    pSVar2 = this->stream_;
    pOVar29 = cast<wabt::OpcodeExpr<(wabt::ExprType)47>,wabt::Expr>(local_20);
    WriteOpcode(pSVar2,(Opcode)(pOVar29->opcode).enum_);
    break;
  case Last:
    pSVar2 = this->stream_;
    Opcode::Opcode(&local_1b0,Unreachable);
    WriteOpcode(pSVar2,local_1b0);
  }
  return;
}

Assistant:

void BinaryWriter::WriteExpr(const Func* func, const Expr* expr) {
  switch (expr->type()) {
    case ExprType::AtomicLoad:
      WriteLoadStoreExpr<AtomicLoadExpr>(func, expr, "memory offset");
      break;
    case ExprType::AtomicRmw:
      WriteLoadStoreExpr<AtomicRmwExpr>(func, expr, "memory offset");
      break;
    case ExprType::AtomicRmwCmpxchg:
      WriteLoadStoreExpr<AtomicRmwCmpxchgExpr>(func, expr, "memory offset");
      break;
    case ExprType::AtomicStore:
      WriteLoadStoreExpr<AtomicStoreExpr>(func, expr, "memory offset");
      break;
    case ExprType::AtomicWait:
      WriteLoadStoreExpr<AtomicWaitExpr>(func, expr, "memory offset");
      break;
    case ExprType::AtomicWake:
      WriteLoadStoreExpr<AtomicWakeExpr>(func, expr, "memory offset");
      break;
    case ExprType::Binary:
      WriteOpcode(stream_, cast<BinaryExpr>(expr)->opcode);
      break;
    case ExprType::Block:
      WriteOpcode(stream_, Opcode::Block);
      WriteBlockDecl(cast<BlockExpr>(expr)->block.decl);
      WriteExprList(func, cast<BlockExpr>(expr)->block.exprs);
      WriteOpcode(stream_, Opcode::End);
      break;
    case ExprType::Br:
      WriteOpcode(stream_, Opcode::Br);
      WriteU32Leb128(stream_, GetLabelVarDepth(&cast<BrExpr>(expr)->var),
                     "break depth");
      break;
    case ExprType::BrIf:
      WriteOpcode(stream_, Opcode::BrIf);
      WriteU32Leb128(stream_, GetLabelVarDepth(&cast<BrIfExpr>(expr)->var),
                     "break depth");
      break;
    case ExprType::BrTable: {
      auto* br_table_expr = cast<BrTableExpr>(expr);
      WriteOpcode(stream_, Opcode::BrTable);
      WriteU32Leb128(stream_, br_table_expr->targets.size(), "num targets");
      Index depth;
      for (const Var& var : br_table_expr->targets) {
        depth = GetLabelVarDepth(&var);
        WriteU32Leb128(stream_, depth, "break depth");
      }
      depth = GetLabelVarDepth(&br_table_expr->default_target);
      WriteU32Leb128(stream_, depth, "break depth for default");
      break;
    }
    case ExprType::Call:{
      Index index = module_->GetFuncIndex(cast<CallExpr>(expr)->var);
      WriteOpcode(stream_, Opcode::Call);
      WriteU32Leb128WithReloc(index, "function index", RelocType::FuncIndexLEB);
      break;
    }
    case ExprType::ReturnCall: {
      Index index = module_->GetFuncIndex(cast<ReturnCallExpr>(expr)->var);
      WriteOpcode(stream_, Opcode::ReturnCall);
      WriteU32Leb128WithReloc(index, "function index", RelocType::FuncIndexLEB);
      break;
    }
    case ExprType::CallIndirect:{
      Index index =
        module_->GetFuncTypeIndex(cast<CallIndirectExpr>(expr)->decl);
      WriteOpcode(stream_, Opcode::CallIndirect);
      WriteU32Leb128WithReloc(index, "signature index", RelocType::TypeIndexLEB);
      WriteU32Leb128(stream_, 0, "call_indirect reserved");
      break;
    }
    case ExprType::ReturnCallIndirect: {
      Index index =
          module_->GetFuncTypeIndex(cast<ReturnCallIndirectExpr>(expr)->decl);
      WriteOpcode(stream_, Opcode::ReturnCallIndirect);
      WriteU32Leb128WithReloc(index, "signature index", RelocType::TypeIndexLEB);
      WriteU32Leb128(stream_, 0, "return_call_indirect reserved");
      break;
    }
    case ExprType::Compare:
      WriteOpcode(stream_, cast<CompareExpr>(expr)->opcode);
      break;
    case ExprType::Const: {
      const Const& const_ = cast<ConstExpr>(expr)->const_;
      switch (const_.type) {
        case Type::I32: {
          WriteOpcode(stream_, Opcode::I32Const);
          WriteS32Leb128(stream_, const_.u32, "i32 literal");
          break;
        }
        case Type::I64:
          WriteOpcode(stream_, Opcode::I64Const);
          WriteS64Leb128(stream_, const_.u64, "i64 literal");
          break;
        case Type::F32:
          WriteOpcode(stream_, Opcode::F32Const);
          stream_->WriteU32(const_.f32_bits, "f32 literal");
          break;
        case Type::F64:
          WriteOpcode(stream_, Opcode::F64Const);
          stream_->WriteU64(const_.f64_bits, "f64 literal");
          break;
        case Type::V128:
          WriteOpcode(stream_, Opcode::V128Const);
          stream_->WriteU128(const_.v128_bits, "v128 literal");
          break;
        default:
          assert(0);
      }
      break;
    }
    case ExprType::Convert:
      WriteOpcode(stream_, cast<ConvertExpr>(expr)->opcode);
      break;
    case ExprType::Drop:
      WriteOpcode(stream_, Opcode::Drop);
      break;
    case ExprType::GetGlobal: {
      Index index = module_->GetGlobalIndex(cast<GetGlobalExpr>(expr)->var);
      WriteOpcode(stream_, Opcode::GetGlobal);
      WriteU32Leb128WithReloc(index, "global index", RelocType::GlobalIndexLEB);
      break;
    }
    case ExprType::GetLocal: {
      Index index = GetLocalIndex(func, cast<GetLocalExpr>(expr)->var);
      WriteOpcode(stream_, Opcode::GetLocal);
      WriteU32Leb128(stream_, index, "local index");
      break;
    }
    case ExprType::If: {
      auto* if_expr = cast<IfExpr>(expr);
      WriteOpcode(stream_, Opcode::If);
      WriteBlockDecl(if_expr->true_.decl);
      WriteExprList(func, if_expr->true_.exprs);
      if (!if_expr->false_.empty()) {
        WriteOpcode(stream_, Opcode::Else);
        WriteExprList(func, if_expr->false_);
      }
      WriteOpcode(stream_, Opcode::End);
      break;
    }
    case ExprType::IfExcept: {
      auto* if_except_expr = cast<IfExceptExpr>(expr);
      WriteOpcode(stream_, Opcode::IfExcept);
      WriteBlockDecl(if_except_expr->true_.decl);
      Index index = module_->GetExceptIndex(if_except_expr->except_var);
      WriteU32Leb128(stream_, index, "exception index");
      WriteExprList(func, if_except_expr->true_.exprs);
      if (!if_except_expr->false_.empty()) {
        WriteOpcode(stream_, Opcode::Else);
        WriteExprList(func, if_except_expr->false_);
      }
      WriteOpcode(stream_, Opcode::End);
      break;
    }
    case ExprType::Load:
      WriteLoadStoreExpr<LoadExpr>(func, expr, "load offset");
      break;
    case ExprType::Loop:
      WriteOpcode(stream_, Opcode::Loop);
      WriteBlockDecl(cast<LoopExpr>(expr)->block.decl);
      WriteExprList(func, cast<LoopExpr>(expr)->block.exprs);
      WriteOpcode(stream_, Opcode::End);
      break;
    case ExprType::MemoryCopy:
      WriteOpcode(stream_, Opcode::MemoryCopy);
      WriteU32Leb128(stream_, 0, "memory.copy reserved");
      break;
    case ExprType::MemoryDrop: {
      Index index =
          module_->GetDataSegmentIndex(cast<MemoryDropExpr>(expr)->var);
      WriteOpcode(stream_, Opcode::MemoryDrop);
      WriteU32Leb128(stream_, index, "memory.drop segment");
      break;
    }
    case ExprType::MemoryFill:
      WriteOpcode(stream_, Opcode::MemoryFill);
      WriteU32Leb128(stream_, 0, "memory.fill reserved");
      break;
    case ExprType::MemoryGrow:
      WriteOpcode(stream_, Opcode::MemoryGrow);
      WriteU32Leb128(stream_, 0, "memory.grow reserved");
      break;
    case ExprType::MemoryInit: {
      Index index =
          module_->GetDataSegmentIndex(cast<MemoryInitExpr>(expr)->var);
      WriteOpcode(stream_, Opcode::MemoryInit);
      WriteU32Leb128(stream_, 0, "memory.init reserved");
      WriteU32Leb128(stream_, index, "memory.init segment");
      break;
    }
    case ExprType::MemorySize:
      WriteOpcode(stream_, Opcode::MemorySize);
      WriteU32Leb128(stream_, 0, "memory.size reserved");
      break;
    case ExprType::TableCopy:
      WriteOpcode(stream_, Opcode::TableCopy);
      WriteU32Leb128(stream_, 0, "table.copy reserved");
      break;
    case ExprType::TableDrop: {
      Index index =
          module_->GetElemSegmentIndex(cast<TableDropExpr>(expr)->var);
      WriteOpcode(stream_, Opcode::TableDrop);
      WriteU32Leb128(stream_, index, "table.drop segment");
      break;
    }
    case ExprType::TableInit: {
      Index index =
          module_->GetElemSegmentIndex(cast<TableInitExpr>(expr)->var);
      WriteOpcode(stream_, Opcode::TableInit);
      WriteU32Leb128(stream_, 0, "table.init reserved");
      WriteU32Leb128(stream_, index, "table.init segment");
      break;
    }
    case ExprType::Nop:
      WriteOpcode(stream_, Opcode::Nop);
      break;
    case ExprType::Rethrow:
      WriteOpcode(stream_, Opcode::Rethrow);
      break;
    case ExprType::Return:
      WriteOpcode(stream_, Opcode::Return);
      break;
    case ExprType::Select:
      WriteOpcode(stream_, Opcode::Select);
      break;
    case ExprType::SetGlobal: {
      Index index = module_->GetGlobalIndex(cast<SetGlobalExpr>(expr)->var);
      WriteOpcode(stream_, Opcode::SetGlobal);
      WriteU32Leb128WithReloc(index, "global index", RelocType::GlobalIndexLEB);
      break;
    }
    case ExprType::SetLocal: {
      Index index = GetLocalIndex(func, cast<SetLocalExpr>(expr)->var);
      WriteOpcode(stream_, Opcode::SetLocal);
      WriteU32Leb128(stream_, index, "local index");
      break;
    }
    case ExprType::Store:
      WriteLoadStoreExpr<StoreExpr>(func, expr, "store offset");
      break;
    case ExprType::TeeLocal: {
      Index index = GetLocalIndex(func, cast<TeeLocalExpr>(expr)->var);
      WriteOpcode(stream_, Opcode::TeeLocal);
      WriteU32Leb128(stream_, index, "local index");
      break;
    }
    case ExprType::Throw:
      WriteOpcode(stream_, Opcode::Throw);
      WriteU32Leb128(stream_, GetExceptVarDepth(&cast<ThrowExpr>(expr)->var),
                     "throw exception");
      break;
    case ExprType::Try: {
      auto* try_expr = cast<TryExpr>(expr);
      WriteOpcode(stream_, Opcode::Try);
      WriteBlockDecl(try_expr->block.decl);
      WriteExprList(func, try_expr->block.exprs);
      WriteOpcode(stream_, Opcode::Catch);
      WriteExprList(func, try_expr->catch_);
      WriteOpcode(stream_, Opcode::End);
      break;
    }
    case ExprType::Unary:
      WriteOpcode(stream_, cast<UnaryExpr>(expr)->opcode);
      break;
    case ExprType::Ternary:
      WriteOpcode(stream_, cast<TernaryExpr>(expr)->opcode);
      break;
    case ExprType::SimdLaneOp: {
      const Opcode opcode = cast<SimdLaneOpExpr>(expr)->opcode;
      WriteOpcode(stream_, opcode);
      stream_->WriteU8(static_cast<uint8_t>(cast<SimdLaneOpExpr>(expr)->val),
                       "Simd Lane literal");
      break;
    }
    case ExprType::SimdShuffleOp: {
      const Opcode opcode = cast<SimdShuffleOpExpr>(expr)->opcode;
      WriteOpcode(stream_, opcode);
      stream_->WriteU128(cast<SimdShuffleOpExpr>(expr)->val,
                         "Simd Lane[16] literal");
      break;
    }
    case ExprType::Unreachable:
      WriteOpcode(stream_, Opcode::Unreachable);
      break;
  }
}